

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
llvm::SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>>::
emplace_back<int,llvm::SmallVector<unsigned_int,0u>>
          (SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>> *this,
          int *Args,SmallVector<unsigned_int,_0U> *Args_1)

{
  int *piVar1;
  uint uVar2;
  
  if (*(uint *)(this + 0xc) <= *(uint *)(this + 8)) {
    SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>::
    grow((SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
          *)this,0);
  }
  piVar1 = (int *)(*(long *)this + (ulong)*(uint *)(this + 8) * 0x18);
  *piVar1 = *Args;
  SmallVector<unsigned_int,_0U>::SmallVector((SmallVector<unsigned_int,_0U> *)(piVar1 + 2),Args_1);
  if (*(uint *)(this + 8) < *(uint *)(this + 0xc)) {
    uVar2 = *(uint *)(this + 8) + 1;
    *(uint *)(this + 8) = uVar2;
    if (uVar2 != 0) {
      return (reference)(*(long *)this + (ulong)uVar2 * 0x18 + -0x18);
    }
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0xa7,
                  "reference llvm::SmallVectorTemplateCommon<std::pair<unsigned int, llvm::SmallVector<unsigned int, 0>>>::back() [T = std::pair<unsigned int, llvm::SmallVector<unsigned int, 0>>]"
                 );
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }